

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAsymmetricIShapeProfileDef::~IfcAsymmetricIShapeProfileDef
          (IfcAsymmetricIShapeProfileDef *this)

{
  Maybe<double> *pMVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)
   &this[-1].super_IfcIShapeProfileDef.super_IfcParameterizedProfileDef.super_IfcProfileDef.
    field_0x60 = 0x881628;
  *(undefined8 *)
   ((long)&(this->super_IfcIShapeProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
           ProfileName.ptr.field_2 + 8) = 0x881650;
  puVar2 = (undefined1 *)this[-1].super_IfcIShapeProfileDef.WebThickness;
  pMVar1 = &this[-1].super_IfcIShapeProfileDef.FilletRadius;
  if ((Maybe<double> *)puVar2 != pMVar1) {
    operator_delete(puVar2,(long)pMVar1->ptr + 1);
  }
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcIShapeProfileDef.super_IfcParameterizedProfileDef.field_0x70;
  puVar3 = &this[-1].super_IfcIShapeProfileDef.super_IfcParameterizedProfileDef.field_0x80;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
  }
  operator_delete(&this[-1].super_IfcIShapeProfileDef.super_IfcParameterizedProfileDef.
                   super_IfcProfileDef.field_0x60,0x110);
  return;
}

Assistant:

IfcAsymmetricIShapeProfileDef() : Object("IfcAsymmetricIShapeProfileDef") {}